

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangling_pointer.cpp
# Opt level: O0

int main(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 auStack_50 [8];
  string_view sv;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string s;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_28,"Hellooooooooooooooo ",&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
                 "World\n");
  _auStack_50 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,_auStack_50);
  std::__cxx11::string::~string((string *)local_28);
  return 0;
}

Assistant:

int main() {
  std::string s = "Hellooooooooooooooo ";
  std::string_view sv = s + "World\n";
  std::cout << sv;
}